

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

void tcache_gc_small(tsd_t *tsd,tcache_slow_t *tcache_slow,tcache_t *tcache,szind_t szind)

{
  uint8_t uVar1;
  cache_bin_sz_t cVar2;
  cache_bin_sz_t cVar3;
  uint uVar4;
  uint in_ECX;
  tcache_t *in_RDX;
  long in_RSI;
  tsd_t *in_RDI;
  uint8_t nflush_uint8;
  size_t nflush;
  cache_bin_sz_t low_water;
  cache_bin_sz_t ncached;
  cache_bin_t *cache_bin;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  cVar2 = cache_bin_ncached_get_local
                    ((cache_bin_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  cVar3 = cache_bin_low_water_get
                    ((cache_bin_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  uVar4 = (uint)cVar3 - ((int)(uint)cVar3 >> 2);
  if (uVar4 < *(byte *)(in_RSI + 0x80 + (ulong)in_ECX)) {
    *(char *)(in_RSI + 0x80 + (ulong)in_ECX) =
         *(char *)(in_RSI + 0x80 + (ulong)in_ECX) - (char)uVar4;
  }
  else {
    uVar1 = tcache_gc_item_delay_compute(in_ECX);
    *(uint8_t *)(in_RSI + 0x80 + (ulong)in_ECX) = uVar1;
    duckdb_je_tcache_bin_flush_small(in_RDI,in_RDX,in_RDX->bins + in_ECX,in_ECX,cVar2 - uVar4);
    cVar2 = cache_bin_ncached_max_get((cache_bin_t *)0x258974b);
    if (1 < (int)(uint)cVar2 >> (*(byte *)(in_RSI + 0x38 + (ulong)in_ECX) & 0x1f)) {
      *(char *)(in_RSI + 0x38 + (ulong)in_ECX) = *(char *)(in_RSI + 0x38 + (ulong)in_ECX) + '\x01';
    }
  }
  return;
}

Assistant:

static void
tcache_gc_small(tsd_t *tsd, tcache_slow_t *tcache_slow, tcache_t *tcache,
    szind_t szind) {
	/* Aim to flush 3/4 of items below low-water. */
	assert(szind < SC_NBINS);

	cache_bin_t *cache_bin = &tcache->bins[szind];
	assert(!tcache_bin_disabled(szind, cache_bin, tcache->tcache_slow));
	cache_bin_sz_t ncached = cache_bin_ncached_get_local(cache_bin);
	cache_bin_sz_t low_water = cache_bin_low_water_get(cache_bin);
	assert(!tcache_slow->bin_refilled[szind]);

	size_t nflush = low_water - (low_water >> 2);
	if (nflush < tcache_slow->bin_flush_delay_items[szind]) {
		/* Workaround for a conversion warning. */
		uint8_t nflush_uint8 = (uint8_t)nflush;
		assert(sizeof(tcache_slow->bin_flush_delay_items[0]) ==
		    sizeof(nflush_uint8));
		tcache_slow->bin_flush_delay_items[szind] -= nflush_uint8;
		return;
	}

	tcache_slow->bin_flush_delay_items[szind]
	    = tcache_gc_item_delay_compute(szind);
	tcache_bin_flush_small(tsd, tcache, cache_bin, szind,
	    (unsigned)(ncached - nflush));

	/*
	 * Reduce fill count by 2X.  Limit lg_fill_div such that
	 * the fill count is always at least 1.
	 */
	if ((cache_bin_ncached_max_get(cache_bin) >>
	     tcache_slow->lg_fill_div[szind]) > 1) {
		tcache_slow->lg_fill_div[szind]++;
	}
}